

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolve_avx2.h
# Opt level: O0

__m256i * xy_y_convolve_6tap_4x2_avx2(int16_t *src,__m128i *s_64,__m256i *ss_256,__m256i *coeffs)

{
  __m256i alVar1;
  __m256i *ss;
  __m256i *coeffs_00;
  longlong lVar2;
  longlong lVar3;
  longlong lVar4;
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  __m256i *in_RDX;
  long in_RSI;
  long in_RDI;
  __m256i r;
  __m256i s_256 [2];
  
  *(undefined8 *)(in_RSI + 0x50) = *(undefined8 *)(in_RDI + 0x28);
  *(undefined8 *)(in_RSI + 0x58) = 0;
  ss = *(__m256i **)*(undefined1 (*) [32])(in_RSI + 0x40);
  auVar6 = *(undefined1 (*) [32])(in_RSI + 0x40);
  *(undefined8 *)(in_RSI + 0x40) = *(undefined8 *)(in_RDI + 0x30);
  *(undefined8 *)(in_RSI + 0x48) = 0;
  coeffs_00 = *(__m256i **)(in_RSI + 0x58);
  auVar5._16_8_ = *(undefined8 *)(in_RSI + 0x40);
  auVar5._0_16_ = *(undefined1 (*) [16])(in_RSI + 0x50);
  auVar5._24_8_ = *(undefined8 *)(in_RSI + 0x48);
  alVar1 = (__m256i)vpunpcklwd_avx2(auVar6,auVar5);
  in_RDX[2] = alVar1;
  convolve16_6tap_avx2(ss,coeffs_00);
  lVar2 = in_RDX[1][1];
  lVar3 = in_RDX[1][2];
  lVar4 = in_RDX[1][3];
  (*in_RDX)[0] = in_RDX[1][0];
  (*in_RDX)[1] = lVar2;
  (*in_RDX)[2] = lVar3;
  (*in_RDX)[3] = lVar4;
  lVar2 = in_RDX[2][1];
  lVar3 = in_RDX[2][2];
  lVar4 = in_RDX[2][3];
  in_RDX[1][0] = in_RDX[2][0];
  in_RDX[1][1] = lVar2;
  in_RDX[1][2] = lVar3;
  in_RDX[1][3] = lVar4;
  return in_RDX;
}

Assistant:

static inline __m256i xy_y_convolve_6tap_4x2_avx2(const int16_t *const src,
                                                  __m128i s_64[6],
                                                  __m256i ss_256[3],
                                                  const __m256i coeffs[3]) {
  __m256i s_256[2];
  s_64[5] = _mm_loadl_epi64((__m128i *)(src + 5 * 4));
  s_256[0] = _mm256_setr_m128i(s_64[4], s_64[5]);
  s_64[4] = _mm_loadl_epi64((__m128i *)(src + 6 * 4));
  s_256[1] = _mm256_setr_m128i(s_64[5], s_64[4]);
  ss_256[2] = _mm256_unpacklo_epi16(s_256[0], s_256[1]);
  const __m256i r = convolve16_6tap_avx2(ss_256, coeffs);
  ss_256[0] = ss_256[1];
  ss_256[1] = ss_256[2];
  return r;
}